

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int y;
  int iVar8;
  int iVar9;
  int iVar10;
  CImg<unsigned_char> *pCVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uchar *puVar23;
  uchar *puVar24;
  int y_1;
  int iVar25;
  ulong uVar26;
  size_t __n;
  uchar *puVar27;
  uchar *puVar28;
  CImg<unsigned_char> local_50;
  
  puVar27 = this->_data;
  if (puVar27 != (uchar *)0x0) {
    uVar17 = (ulong)(uint)z0;
    uVar20 = this->_width;
    uVar12 = (ulong)uVar20;
    if (uVar20 != 0) {
      uVar26 = (ulong)(uint)c0;
      uVar1 = this->_height;
      if (uVar1 != 0) {
        uVar2 = this->_depth;
        if (((uVar2 != 0) && (this->_spectrum != 0)) &&
           (puVar23 = sprite->_data, puVar23 != (uchar *)0x0)) {
          lVar16 = uVar1 * uVar12;
          uVar3 = this->_spectrum;
          uVar4 = sprite->_width;
          uVar22 = (ulong)uVar4;
          uVar5 = sprite->_height;
          uVar6 = sprite->_depth;
          uVar7 = sprite->_spectrum;
          if ((puVar23 < puVar27 + (ulong)uVar2 * (ulong)uVar3 * lVar16) &&
             (puVar27 < puVar23 + (ulong)uVar6 * (ulong)uVar7 * uVar5 * uVar22)) {
            CImg(&local_50,sprite,false);
            this = draw_image(this,x0,y0,z0,c0,&local_50,opacity);
            if ((local_50._is_shared == false) && (local_50._data != (uchar *)0x0)) {
              operator_delete__(local_50._data);
            }
          }
          else {
            if ((((((y0 == 0 && x0 == 0) && z0 == 0) && c0 == 0) &&
                 ((1.0 <= opacity && (uVar20 == uVar4)))) && (uVar1 == uVar5)) &&
               (((uVar2 == uVar6 && (uVar3 == uVar7)) && (this->_is_shared == false)))) {
              pCVar11 = assign<unsigned_char>(this,sprite,false);
              return pCVar11;
            }
            iVar14 = uVar20 - (uVar4 + x0);
            if ((int)(uVar4 + x0) <= (int)uVar20) {
              iVar14 = 0;
            }
            uVar20 = x0 >> 0x1f & x0;
            iVar15 = iVar14 + uVar4 + uVar20;
            iVar14 = uVar1 - (uVar5 + y0);
            if ((int)(uVar5 + y0) <= (int)uVar1) {
              iVar14 = 0;
            }
            iVar25 = uVar2 - (uVar6 + z0);
            if ((int)(uVar6 + z0) <= (int)uVar2) {
              iVar25 = 0;
            }
            iVar18 = uVar3 - (c0 + uVar7);
            if ((int)(c0 + uVar7) <= (int)uVar3) {
              iVar18 = 0;
            }
            if (0 < iVar15) {
              iVar14 = (y0 >> 0x1f & y0) + uVar5 + iVar14;
              if (0 < iVar14) {
                iVar25 = (z0 >> 0x1f & z0) + uVar6 + iVar25;
                if (0 < iVar25) {
                  iVar18 = uVar7 + (c0 >> 0x1f & c0) + iVar18;
                  if (0 < iVar18) {
                    __n = (size_t)iVar15;
                    puVar23 = puVar23 + (((-(long)(int)(y0 >> 0x1f & uVar4 * y0) - (long)(int)uVar20
                                          ) - (long)(int)(z0 >> 0x1f & uVar5 * uVar4 * z0)) -
                                        (long)(int)(c0 >> 0x1f & uVar6 * c0 * uVar5 * uVar4));
                    uVar21 = (ulong)(uint)x0;
                    if (x0 < 1) {
                      uVar21 = 0;
                    }
                    uVar19 = (ulong)(uint)y0;
                    if (y0 < 1) {
                      uVar19 = 0;
                    }
                    if (z0 < 1) {
                      uVar17 = 0;
                    }
                    iVar10 = 0;
                    if (c0 < 1) {
                      uVar26 = 0;
                    }
                    puVar27 = puVar27 + (ulong)uVar2 * lVar16 * uVar26 +
                                        uVar17 * lVar16 + uVar19 * uVar12 + uVar21;
                    do {
                      iVar9 = 0;
                      do {
                        if (1.0 <= opacity) {
                          iVar8 = 0;
                          do {
                            memcpy(puVar27,puVar23,__n);
                            puVar27 = puVar27 + this->_width;
                            puVar23 = puVar23 + sprite->_width;
                            iVar8 = iVar8 + 1;
                          } while (iVar8 < iVar14);
                        }
                        else {
                          iVar8 = 0;
                          do {
                            puVar28 = puVar27;
                            puVar24 = puVar23;
                            lVar13 = 0;
                            do {
                              puVar28[lVar13] =
                                   (uchar)(int)((float)puVar24[lVar13] * ABS(opacity) +
                                               (float)puVar28[lVar13] *
                                               (1.0 - (float)(-(uint)(0.0 <= opacity) &
                                                             (uint)opacity)));
                              lVar13 = lVar13 + 1;
                            } while ((int)lVar13 < iVar15);
                            iVar8 = iVar8 + 1;
                            puVar23 = puVar24 + lVar13 + (uVar22 - __n);
                            puVar27 = puVar28 + lVar13 + (uVar12 - __n);
                          } while (iVar8 < iVar14);
                          puVar27 = puVar28 + lVar13 + (uVar12 - __n);
                          puVar23 = puVar24 + lVar13 + (uVar22 - __n);
                        }
                        puVar23 = puVar23 + (uVar5 - iVar14) * uVar22;
                        puVar27 = puVar27 + (uVar1 - iVar14) * uVar12;
                        iVar9 = iVar9 + 1;
                      } while (iVar9 < iVar25);
                      puVar27 = puVar27 + (ulong)(uVar2 - iVar25) * lVar16;
                      puVar23 = puVar23 + uVar5 * uVar22 * (ulong)(uVar6 - iVar25);
                      iVar10 = iVar10 + 1;
                    } while (iVar10 < iVar18);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared())
        return assign(sprite,false);
      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const T
        *ptrs = sprite._data -
        (bx?x0:0) -
        (by?y0*sprite.width():0) -
        (bz?z0*sprite.width()*sprite.height():0) -
        (bc?c0*sprite.width()*sprite.height()*sprite.depth():0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ),
        slX = lX*sizeof(T);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
        T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            if (opacity>=1)
              for (int y = 0; y<lY; ++y) { std::memcpy(ptrd,ptrs,slX); ptrd+=_width; ptrs+=sprite._width; }
            else for (int y = 0; y<lY; ++y) {
                for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
                ptrd+=offX; ptrs+=soffX;
              }
            ptrd+=offY; ptrs+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ;
        }
      }
      return *this;
    }